

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O0

Ptr __thiscall
TgBot::TgTypeParser::parseJsonAndGetInlineQueryResultVenue(TgTypeParser *this,ptree *data)

{
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pbVar1;
  type_conflict4 tVar2;
  element_type *peVar3;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  float fVar4;
  Ptr PVar5;
  int local_2f0 [2];
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e8;
  int local_2b8 [2];
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b0;
  allocator local_279;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_250;
  type local_220;
  allocator local_1f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0;
  type local_1a0;
  allocator local_179;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  type local_120;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  undefined1 local_21;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  ptree *data_local;
  TgTypeParser *this_local;
  shared_ptr<TgBot::InlineQueryResultVenue> *result;
  
  local_21 = 0;
  local_20 = in_RDX;
  data_local = data;
  this_local = this;
  std::make_shared<TgBot::InlineQueryResultVenue>();
  pbVar1 = local_20;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_58,"latitude",0x2e);
  fVar4 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<float>(pbVar1,&local_58);
  peVar3 = std::
           __shared_ptr_access<TgBot::InlineQueryResultVenue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<TgBot::InlineQueryResultVenue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  peVar3->latitude = fVar4;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_58);
  pbVar1 = local_20;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_a0,"longitude",0x2e);
  fVar4 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<float>(pbVar1,&local_a0);
  peVar3 = std::
           __shared_ptr_access<TgBot::InlineQueryResultVenue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<TgBot::InlineQueryResultVenue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  peVar3->longitude = fVar4;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_a0);
  pbVar1 = local_20;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_f8,"address",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get<std::__cxx11::string>
            (&local_c8,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)pbVar1,&local_f8);
  peVar3 = std::
           __shared_ptr_access<TgBot::InlineQueryResultVenue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<TgBot::InlineQueryResultVenue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  std::__cxx11::string::operator=((string *)&peVar3->address,(string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_f8);
  pbVar1 = local_20;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_150,"foursquare_id",0x2e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178,"",&local_179);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get<std::__cxx11::string>
            (&local_120,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)pbVar1,&local_150,&local_178);
  peVar3 = std::
           __shared_ptr_access<TgBot::InlineQueryResultVenue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<TgBot::InlineQueryResultVenue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  std::__cxx11::string::operator=((string *)&peVar3->foursquareId,(string *)&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_150);
  pbVar1 = local_20;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_1d0,"foursquare_type",0x2e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f8,"",&local_1f9);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get<std::__cxx11::string>
            (&local_1a0,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)pbVar1,&local_1d0,&local_1f8);
  peVar3 = std::
           __shared_ptr_access<TgBot::InlineQueryResultVenue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<TgBot::InlineQueryResultVenue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  std::__cxx11::string::operator=((string *)&peVar3->foursquareType,(string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_1d0);
  pbVar1 = local_20;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_250,"thumb_url",0x2e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_278,"",&local_279);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get<std::__cxx11::string>
            (&local_220,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)pbVar1,&local_250,&local_278);
  peVar3 = std::
           __shared_ptr_access<TgBot::InlineQueryResultVenue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<TgBot::InlineQueryResultVenue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  std::__cxx11::string::operator=((string *)&peVar3->thumbUrl,(string *)&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_250);
  pbVar1 = local_20;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_2b0,"thumb_width",0x2e);
  local_2b8[0] = 0;
  tVar2 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<int>(pbVar1,&local_2b0,local_2b8);
  peVar3 = std::
           __shared_ptr_access<TgBot::InlineQueryResultVenue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<TgBot::InlineQueryResultVenue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  peVar3->thumbWidth = tVar2;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_2b0);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_2e8,"thumb_height",0x2e);
  local_2f0[0] = 0;
  tVar2 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<int>(local_20,&local_2e8,local_2f0);
  peVar3 = std::
           __shared_ptr_access<TgBot::InlineQueryResultVenue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<TgBot::InlineQueryResultVenue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  peVar3->thumbHeight = tVar2;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_2e8);
  PVar5.super___shared_ptr<TgBot::InlineQueryResultVenue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  PVar5.super___shared_ptr<TgBot::InlineQueryResultVenue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar5.super___shared_ptr<TgBot::InlineQueryResultVenue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

InlineQueryResultVenue::Ptr TgTypeParser::parseJsonAndGetInlineQueryResultVenue(const boost::property_tree::ptree& data) const {
    // NOTE: This function will be called by parseJsonAndGgetInlineQueryResult().
    auto result(make_shared<InlineQueryResultVenue>());
    result->latitude = data.get<float>("latitude");
    result->longitude = data.get<float>("longitude");
    result->address = data.get<string>("address");
    result->foursquareId = data.get<string>("foursquare_id", "");
    result->foursquareType = data.get<string>("foursquare_type", "");
    result->thumbUrl = data.get<string>("thumb_url", "");
    result->thumbWidth = data.get<int32_t>("thumb_width", 0);
    result->thumbHeight = data.get<int32_t>("thumb_height", 0);
    return result;
}